

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_25095d::NodeArray::printWithComma(NodeArray *this,OutputStream *S)

{
  size_t sVar1;
  bool bVar2;
  size_t Idx;
  size_t sVar3;
  size_t sVar4;
  StringView R;
  
  bVar2 = true;
  for (sVar3 = 0; sVar3 != this->NumElements; sVar3 = sVar3 + 1) {
    sVar1 = S->CurrentPosition;
    sVar4 = sVar1;
    if (!bVar2) {
      R.Last = "";
      R.First = ", ";
      OutputStream::operator+=(S,R);
      sVar4 = S->CurrentPosition;
    }
    Node::print(this->Elements[sVar3],S);
    if (sVar4 == S->CurrentPosition) {
      S->CurrentPosition = sVar1;
    }
    else {
      bVar2 = false;
    }
  }
  return;
}

Assistant:

void printWithComma(OutputStream &S) const {
    bool FirstElement = true;
    for (size_t Idx = 0; Idx != NumElements; ++Idx) {
      size_t BeforeComma = S.getCurrentPosition();
      if (!FirstElement)
        S += ", ";
      size_t AfterComma = S.getCurrentPosition();
      Elements[Idx]->print(S);

      // Elements[Idx] is an empty parameter pack expansion, we should erase the
      // comma we just printed.
      if (AfterComma == S.getCurrentPosition()) {
        S.setCurrentPosition(BeforeComma);
        continue;
      }

      FirstElement = false;
    }
  }